

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O0

void mcpl_generic_fwseek(mcpl_generic_wfilehandle_t *fh,uint64_t position)

{
  long lVar1;
  long in_RSI;
  undefined8 *in_RDI;
  int rv;
  int local_14;
  
  if (in_RSI == -1) {
    local_14 = fseek((FILE *)*in_RDI,0,2);
    lVar1 = ftell((FILE *)*in_RDI);
    in_RDI[1] = lVar1;
  }
  else {
    local_14 = fseek((FILE *)*in_RDI,in_RSI,0);
    in_RDI[1] = in_RSI;
  }
  if (local_14 != 0) {
    mcpl_error((char *)0x1091e4);
  }
  return;
}

Assistant:

void mcpl_generic_fwseek( mcpl_generic_wfilehandle_t* fh,
                          uint64_t position )
{
  int rv;
  if ( position == UINT64_MAX ) {
    rv = MCPL_FSEEK_END( (FILE*)(fh->internal) );
    fh->current_pos = (uint64_t)MCPL_FTELL((FILE*)(fh->internal));
  } else {
    rv = MCPL_FSEEK( (FILE*)(fh->internal), position );
    fh->current_pos = position;
  }
  if ( rv != 0 )
    mcpl_error("Error while seeking in output file");
}